

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QRect __thiscall QTreeViewPrivate::itemDecorationRect(QTreeViewPrivate *this,QModelIndex *index)

{
  QRect QVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QModelIndex *_index;
  QStyle *pQVar7;
  QTreeViewPrivate *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar8;
  int size;
  int position;
  int itemIndentation;
  int viewItemIndex;
  QTreeView *q;
  QRect rect;
  QStyleOption opt;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QTreeViewPrivate *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff14;
  QHeaderView *this_00;
  bool local_c9;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  QVar8._8_8_ = local_50;
  QVar8._0_8_ = local_58;
  QVar1._8_8_ = local_50;
  QVar1._0_8_ = local_58;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _index = (QModelIndex *)q_func(in_RDI);
  local_c9 = false;
  if ((in_RDI->rootDecoration & 1U) == 0) {
    QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                       );
    local_c9 = ::operator==((QModelIndex *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (QPersistentModelIndex *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  if (local_c9 == false) {
    iVar3 = viewIndex(in_RSI,_index);
    if (-1 < iVar3) {
      QList<QTreeViewItem>::at
                ((QList<QTreeViewItem> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      bVar2 = hasVisibleChildren((QTreeViewPrivate *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                 (QModelIndex *)
                                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      if (bVar2) {
        iVar4 = indentationForItem(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        this_00 = in_RDI->header;
        logicalIndexForTree((QTreeViewPrivate *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        iVar5 = QHeaderView::sectionViewportPosition(this_00,in_stack_ffffffffffffff14);
        iVar3 = (int)((ulong)in_RDI->header >> 0x20);
        logicalIndexForTree((QTreeViewPrivate *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        iVar6 = QHeaderView::sectionSize
                          ((QHeaderView *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff04);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        bVar2 = QWidget::isRightToLeft((QWidget *)0x90091f);
        if (bVar2) {
          in_stack_ffffffffffffff0c = (iVar5 + iVar6) - iVar4;
          coordinateForItem(in_RDI,iVar3);
          itemHeight((QTreeViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff04);
          QRect::QRect((QRect *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                       in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                      );
          local_80 = local_90;
          local_78 = local_88;
        }
        else {
          in_stack_ffffffffffffff00 = (iVar5 + iVar4) - in_RDI->indent;
          in_stack_ffffffffffffff04 = coordinateForItem(in_RDI,iVar3);
          in_stack_ffffffffffffff08 = in_RDI->indent;
          itemHeight((QTreeViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff04);
          QRect::QRect((QRect *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                       in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                      );
          local_80 = local_a0;
          local_78 = local_98;
        }
        memset(local_48,0xaa,0x40);
        QStyleOption::QStyleOption
                  ((QStyleOption *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        QStyleOption::initFrom
                  ((QStyleOption *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        local_38 = local_80;
        local_30 = local_78;
        pQVar7 = QWidget::style((QWidget *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        QVar8 = (QRect)(**(code **)(*(long *)pQVar7 + 0xc0))(pQVar7,0x19,local_48,_index);
        QStyleOption::~QStyleOption
                  ((QStyleOption *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        goto LAB_00900ab1;
      }
    }
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    QVar8 = QVar1;
  }
  else {
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
LAB_00900ab1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTreeViewPrivate::itemDecorationRect(const QModelIndex &index) const
{
    Q_Q(const QTreeView);
    if (!rootDecoration && index.parent() == root)
        return QRect(); // no decoration at root

    int viewItemIndex = viewIndex(index);
    if (viewItemIndex < 0 || !hasVisibleChildren(viewItems.at(viewItemIndex).index))
        return QRect();

    int itemIndentation = indentationForItem(viewItemIndex);
    int position = header->sectionViewportPosition(logicalIndexForTree());
    int size = header->sectionSize(logicalIndexForTree());

    QRect rect;
    if (q->isRightToLeft())
        rect = QRect(position + size - itemIndentation, coordinateForItem(viewItemIndex),
                     indent, itemHeight(viewItemIndex));
    else
        rect = QRect(position + itemIndentation - indent, coordinateForItem(viewItemIndex),
                     indent, itemHeight(viewItemIndex));
    QStyleOption opt;
    opt.initFrom(q);
    opt.rect = rect;
    return q->style()->subElementRect(QStyle::SE_TreeViewDisclosureItem, &opt, q);
}